

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O3

libcaption_stauts_t caption_frame_decode_control(caption_frame_t *frame,uint16_t cc_data)

{
  char cVar1;
  byte bVar2;
  eia608_control_t eVar3;
  libcaption_stauts_t lVar4;
  caption_frame_buffer_t *pcVar5;
  int cc;
  int local_14;
  
  eVar3 = eia608_parse_control(cc_data,&local_14);
  lVar4 = LIBCAPTION_OK;
  switch(eVar3) {
  case eia608_control_resume_caption_loading:
    *(byte *)&frame->state = *(byte *)&frame->state & 0xcf;
    pcVar5 = &frame->back;
    goto LAB_00104ae9;
  case eia608_control_backspace:
    cVar1 = (frame->state).col;
    bVar2 = cVar1 - 1;
    if (cVar1 < '\x01') {
      bVar2 = 0;
    }
    (frame->state).col = bVar2;
    caption_frame_write_char(frame,(int)(frame->state).row,(uint)bVar2,eia608_style_white,0,"");
    goto LAB_00104ada;
  case eia608_control_alarm_off:
  case eia608_control_alarm_on:
  case 0x1428:
  case eia608_control_text_restart:
  case eia608_control_text_resume_text_display:
    break;
  case eia608_control_delete_to_end_of_row:
    caption_frame_delete_to_end_of_row(frame);
    goto LAB_00104ada;
  case eia608_control_roll_up_2:
    bVar2 = *(byte *)&frame->state & 0xcf | 0x10;
    goto LAB_00104aae;
  case eia608_control_roll_up_3:
    bVar2 = *(byte *)&frame->state & 0xcf | 0x20;
LAB_00104aae:
    *(byte *)&frame->state = bVar2;
    goto LAB_00104ae5;
  case eia608_control_roll_up_4:
    *(byte *)&frame->state = *(byte *)&frame->state | 0x30;
    goto LAB_00104ae5;
  case eia608_control_resume_direct_captioning:
    *(byte *)&frame->state = *(byte *)&frame->state & 0xcf;
LAB_00104ae5:
    pcVar5 = &frame->front;
LAB_00104ae9:
    frame->write = pcVar5;
    break;
  case eia608_control_erase_display_memory:
    pcVar5 = &frame->front;
    goto LAB_00104acb;
  case eia608_control_carriage_return:
    lVar4 = caption_frame_carriage_return(frame);
    break;
  case eia608_control_erase_non_displayed_memory:
    memset(&frame->back,0,0xf00);
    break;
  case eia608_control_end_of_caption:
    pcVar5 = &frame->back;
    memcpy(&frame->front,pcVar5,0xf00);
LAB_00104acb:
    memset(pcVar5,0,0xf00);
LAB_00104ada:
    lVar4 = LIBCAPTION_READY;
    break;
  default:
    if (eVar3 - eia608_tab_offset_0 < 4) {
      (frame->state).col = (char)eVar3 + (frame->state).col + -0x20;
    }
  }
  return lVar4;
}

Assistant:

libcaption_stauts_t caption_frame_decode_control(caption_frame_t* frame, uint16_t cc_data)
{
    int cc;
    eia608_control_t cmd = eia608_parse_control(cc_data, &cc);

    switch (cmd) {
    // PAINT ON
    case eia608_control_resume_direct_captioning:
        frame->state.rup = 0;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_erase_display_memory:
        caption_frame_buffer_clear(&frame->front);
        return LIBCAPTION_READY;

    // ROLL-UP
    case eia608_control_roll_up_2:
        frame->state.rup = 1;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_3:
        frame->state.rup = 2;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_4:
        frame->state.rup = 3;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_carriage_return:
        return caption_frame_carriage_return(frame);

    // Corrections (Is this only valid as part of paint on?)
    case eia608_control_backspace:
        return caption_frame_backspace(frame);
    case eia608_control_delete_to_end_of_row:
        return caption_frame_delete_to_end_of_row(frame);

    // POP ON
    case eia608_control_resume_caption_loading:
        frame->state.rup = 0;
        frame->write = &frame->back;
        return LIBCAPTION_OK;

    case eia608_control_erase_non_displayed_memory:
        caption_frame_buffer_clear(&frame->back);
        return LIBCAPTION_OK;

    case eia608_control_end_of_caption:
        return caption_frame_end(frame);

    // cursor positioning
    case eia608_tab_offset_0:
    case eia608_tab_offset_1:
    case eia608_tab_offset_2:
    case eia608_tab_offset_3:
        frame->state.col += (cmd - eia608_tab_offset_0);
        return LIBCAPTION_OK;

    // Unhandled
    default:
    case eia608_control_alarm_off:
    case eia608_control_alarm_on:
    case eia608_control_text_restart:
    case eia608_control_text_resume_text_display:
        return LIBCAPTION_OK;
    }
}